

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing.cc
# Opt level: O2

void demo::Tracing::ReverseTrace(Tracing *tracer,Formatter *formatter)

{
  Tracing *tracer_00;
  string asStack_38 [32];
  
  if (formatter != (Formatter *)0x0) {
    if (tracer != (Tracing *)0x0) {
      tracer_00 = (tracer->cross_and_capture_to_).capture_to_.previous_;
      ReverseTrace(tracer_00,formatter);
      if (tracer_00 != (Tracing *)0x0) {
        std::operator<<((ostream *)formatter,":");
      }
      std::__cxx11::string::string(asStack_38,(string *)&tracer->name_);
      std::operator<<((ostream *)formatter,asStack_38);
      std::__cxx11::string::~string(asStack_38);
    }
    return;
  }
  __assert_fail("formatter",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]capture-thread/demo/tracing.cc"
                ,0x23,"static void demo::Tracing::ReverseTrace(const Tracing *, Formatter *)");
}

Assistant:

void Tracing::ReverseTrace(const Tracing* tracer, Formatter* formatter) {
  assert(formatter);
  if (tracer) {
    const auto previous = tracer->cross_and_capture_to_.Previous();
    ReverseTrace(previous, formatter);
    if (previous) {
      *formatter << ":";
    }
    *formatter << tracer->name();
  }
}